

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O1

void __thiscall ev3dev::motor::reset(motor *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"reset","");
  set_command(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void reset() { set_command("reset"); }